

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O0

void __thiscall LinkedList::printList(LinkedList *this,Node *head)

{
  ostream *poVar1;
  Node *local_20;
  Node *n;
  Node *head_local;
  LinkedList *this_local;
  
  if (head == (Node *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Empty Linked List");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_20 = head;
    if (head->next == (Node *)0x0) {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,head->data);
      std::operator<<(poVar1," -> ");
    }
    else {
      for (; local_20->next != (Node *)0x0; local_20 = local_20->next) {
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_20->data);
        std::operator<<(poVar1," -> ");
      }
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_20->data);
      std::operator<<(poVar1," -> ");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void LinkedList::printList(Node* head) {
	Node* n = head;

	if (n == NULL) {
		std::cout << "Empty Linked List" << std::endl;
		return;
	}

	if (n->next == nullptr) {
		// Print last number in linked list
		std::cout << n->data << " -> ";
	}
	else {
		while (n->next != NULL) {
			std::cout << n->data << " -> ";
			n = n->next;
		}
		// Print last number in linked list
		std::cout << n->data << " -> ";
	}

	// Create new line
	std::cout << std::endl;
}